

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStg.c
# Opt level: O0

Gia_Man_t * Gia_ManStgRead(char *pFileName,int kHot,int fVerbose)

{
  int local_3c;
  int local_38;
  int nStates;
  int nOuts;
  int nIns;
  Vec_Int_t *vLines;
  Gia_Man_t *p;
  int fVerbose_local;
  int kHot_local;
  char *pFileName_local;
  
  p._0_4_ = fVerbose;
  p._4_4_ = kHot;
  _fVerbose_local = pFileName;
  _nOuts = Gia_ManStgReadLines(pFileName,&nStates,&local_38,&local_3c);
  if (_nOuts == (Vec_Int_t *)0x0) {
    pFileName_local = (char *)0x0;
  }
  else {
    vLines = (Vec_Int_t *)Gia_ManStgKHot(_nOuts,nStates,local_38,local_3c,p._4_4_,(int)p);
    Vec_IntFree(_nOuts);
    pFileName_local = (char *)vLines;
  }
  return (Gia_Man_t *)pFileName_local;
}

Assistant:

Gia_Man_t * Gia_ManStgRead( char * pFileName, int kHot, int fVerbose )
{
    Gia_Man_t * p;
    Vec_Int_t * vLines;
    int nIns, nOuts, nStates;
    vLines = Gia_ManStgReadLines( pFileName, &nIns, &nOuts, &nStates );
    if ( vLines == NULL )
        return NULL;
//    p = Gia_ManStgOneHot( vLines, nIns, nOuts, nStates );
    p = Gia_ManStgKHot( vLines, nIns, nOuts, nStates, kHot, fVerbose );
    Vec_IntFree( vLines );
    return p;
}